

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::unrollIndent(Scanner *this,int ToColumn)

{
  int iVar1;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_68._0_4_ = TK_Error;
  local_68._8_8_ = (iterator)0x0;
  local_68._16_8_ = 0;
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  if (this->FlowLevel == 0) {
    iVar1 = this->Indent;
    while (ToColumn < iVar1) {
      local_68._0_4_ = TK_BlockEnd;
      local_68._8_8_ = this->Current;
      local_68._16_8_ = 1;
      AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
      ::push_back(&this->TokenQueue,(Token *)local_68);
      iVar1 = SmallVectorImpl<int>::pop_back_val(&(this->Indents).super_SmallVectorImpl<int>);
      this->Indent = iVar1;
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool Scanner::unrollIndent(int ToColumn) {
  Token T;
  // Indentation is ignored in flow.
  if (FlowLevel != 0)
    return true;

  while (Indent > ToColumn) {
    T.Kind = Token::TK_BlockEnd;
    T.Range = StringRef(Current, 1);
    TokenQueue.push_back(T);
    Indent = Indents.pop_back_val();
  }

  return true;
}